

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::zeKernelCreateEpilogue
          (ZEbasic_leakChecker *this,ze_module_handle_t param_1,ze_kernel_desc_t *param_2,
          ze_kernel_handle_t *param_3,ze_result_t result)

{
  allocator local_51;
  string local_50 [36];
  ze_result_t local_2c;
  ze_kernel_handle_t *pp_Stack_28;
  ze_result_t result_local;
  ze_kernel_handle_t *param_3_local;
  ze_kernel_desc_t *param_2_local;
  ze_module_handle_t param_1_local;
  ZEbasic_leakChecker *this_local;
  
  local_2c = result;
  if (result == ZE_RESULT_SUCCESS) {
    pp_Stack_28 = param_3;
    param_3_local = (ze_kernel_handle_t *)param_2;
    param_2_local = (ze_kernel_desc_t *)param_1;
    param_1_local = (ze_module_handle_t)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"zeKernelCreate",&local_51);
    countFunctionCall(this,(string *)local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return local_2c;
}

Assistant:

ze_result_t basic_leakChecker::ZEbasic_leakChecker::zeKernelCreateEpilogue(ze_module_handle_t, const ze_kernel_desc_t*, ze_kernel_handle_t*, ze_result_t result) {
        if (result == ZE_RESULT_SUCCESS) {
            countFunctionCall("zeKernelCreate");
        }
        return result;
    }